

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::RuleTests_numSourceTokens_Test::TestBody(RuleTests_numSourceTokens_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *message;
  char *in_RCX;
  string_view line;
  AssertHelper local_150;
  Message local_148;
  int local_140 [2];
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  NT local_120;
  undefined2 local_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  SpanPair nt;
  undefined1 local_f0 [8];
  PhrasalRule rule;
  size_t local_60;
  undefined1 local_58 [8];
  AlignedSentencePair asp;
  RuleTests_numSourceTokens_Test *this_local;
  
  asp.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&rule.sentence,
             "a c e\tb d f\t0-0 1-1 2-2");
  line._M_str = in_RCX;
  line._M_len = local_60;
  readAlignedSentencePair<false,false>((AlignedSentencePair *)local_58,(thrax *)rule.sentence,line);
  PhrasalRule::PhrasalRule((PhrasalRule *)local_f0,(AlignedSentencePair *)local_58);
  local_104 = 1;
  uStack_102 = 2;
  uStack_100 = 1;
  uStack_fe = 2;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2000100020001;
  NT::NT(&local_120,(SpanPair)0x2000100020001);
  pvVar2 = std::array<jhu::thrax::NT,_4UL>::front((array<jhu::thrax::NT,_4UL> *)local_f0);
  (pvVar2->label)._M_str = local_120.label._M_str;
  pvVar2->span = local_120.span;
  (pvVar2->label)._M_len = local_120.label._M_len;
  local_140[1] = 3;
  local_140[0] = PhrasalRule::numTokens<true>((PhrasalRule *)local_f0);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_138,"3","rule.numTokens<true>()",local_140 + 1,local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/rule_test.cpp"
               ,0x1c,message);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  AlignedSentencePair::~AlignedSentencePair((AlignedSentencePair *)local_58);
  return;
}

Assistant:

TEST(RuleTests, numSourceTokens) {
  auto asp = readAlignedSentencePair<false, false>("a c e\tb d f\t0-0 1-1 2-2");
  PhrasalRule rule{asp};
  SpanPair nt{{1, 2}, {1, 2}};
  rule.nts.front() = nt;
  EXPECT_EQ(3, rule.numTokens<true>());
}